

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLib.c
# Opt level: O0

JL_STATUS JlStructToJson(void *Structure,JlMarshallElement *StructDescription,
                        size_t StructDescriptionCount,_Bool IndentedFormat,char **pJsonStringBuffer)

{
  JL_STATUS JVar1;
  JL_OUTPUT_FLAGS OutputFlags;
  char **pJsonStringBuffer_local;
  _Bool IndentedFormat_local;
  size_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  void *Structure_local;
  
  OutputFlags = 0;
  if (IndentedFormat) {
    OutputFlags = 2;
  }
  JVar1 = JlStructToJsonEx(Structure,StructDescription,StructDescriptionCount,OutputFlags,
                           pJsonStringBuffer);
  return JVar1;
}

Assistant:

JL_STATUS
    JlStructToJson
    (
        void const*                 Structure,                      // [in]
        JlMarshallElement const*    StructDescription,              // [in]
        size_t                      StructDescriptionCount,         // [in]
        bool                        IndentedFormat,                 // [in]
        char**                      pJsonStringBuffer               // [out]
    )
{
    return JlStructToJsonEx(
        Structure,
        StructDescription,
        StructDescriptionCount,
        IndentedFormat ? JL_OUTPUT_FLAGS_INDENT : JL_OUTPUT_FLAGS_NONE,
        pJsonStringBuffer );
}